

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InvalidBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidBinsSelectExpr,slang::ast::BinsSelectExpr_const*&>
          (BumpAllocator *this,BinsSelectExpr **args)

{
  BinsSelectExpr *pBVar1;
  InvalidBinsSelectExpr *pIVar2;
  
  pIVar2 = (InvalidBinsSelectExpr *)allocate(this,0x18,8);
  pBVar1 = *args;
  (pIVar2->super_BinsSelectExpr).kind = Invalid;
  (pIVar2->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pIVar2->child = pBVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }